

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

Vec_Wrd_t * Mf_ManTruthCollect(int Limit)

{
  int iVar1;
  byte bVar2;
  int *__ptr;
  Vec_Wrd_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int *__ptr_00;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  word local_a0;
  ulong local_98;
  int *local_90;
  ulong local_88;
  Vec_Wrd_t *local_80;
  ulong local_78;
  long local_70;
  Vec_Wrd_t *local_68;
  long local_60;
  long local_58;
  ulong local_50;
  int *local_48;
  ulong local_40;
  long local_38;
  
  __ptr = Extra_PermSchedule(6);
  local_90 = Extra_GreyCodeSchedule(6);
  pVVar3 = Mpm_ManGetTruthWithCnf(Limit);
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  pVVar4->nCap = 0x100000;
  pVVar4->nSize = 0;
  pwVar5 = (word *)malloc(0x800000);
  pVVar4->pArray = pwVar5;
  __ptr_00 = local_90;
  local_80 = pVVar4;
  if (0 < pVVar3->nSize) {
    uVar10 = pVVar4->nSize;
    lVar9 = 0;
    uVar15 = (ulong)(uint)pVVar4->nCap;
    uVar6 = pVVar4->nCap;
    local_68 = pVVar3;
    local_48 = __ptr;
    do {
      local_98 = local_68->pArray[lVar9];
      lVar11 = 0;
      uVar8 = (ulong)uVar10;
      local_60 = lVar9;
      do {
        uVar17 = -lVar11 ^ local_98;
        lVar9 = 0;
        local_58 = lVar11;
        local_50 = uVar17;
        do {
          uVar7 = uVar8 & 0xffffffff;
          lVar11 = (long)(int)uVar8 << 3;
          lVar12 = 0;
          local_88 = uVar8;
          local_78 = uVar7;
          local_70 = lVar11;
          local_40 = uVar17;
          local_38 = lVar9;
          do {
            uVar8 = s_Truths6[__ptr_00[lVar12]];
            bVar2 = (byte)(1L << ((byte)__ptr_00[lVar12] & 0x3f));
            iVar13 = (int)uVar15;
            if ((int)uVar7 + (int)lVar12 == iVar13) {
              if (iVar13 < 0x10) {
                if (pVVar4->pArray == (word *)0x0) {
                  pwVar5 = (word *)malloc(0x80);
                }
                else {
                  pwVar5 = (word *)realloc(pVVar4->pArray,0x80);
                }
                local_80->pArray = pwVar5;
                uVar16 = 0x10;
              }
              else {
                uVar16 = (ulong)(uint)(iVar13 * 2);
                if (SBORROW4(iVar13,iVar13 * 2) == 0 < iVar13) goto LAB_0076f532;
                if (pVVar4->pArray == (word *)0x0) {
                  pwVar5 = (word *)malloc(uVar16 << 3);
                }
                else {
                  pwVar5 = (word *)realloc(pVVar4->pArray,uVar16 << 3);
                }
                local_80->pArray = pwVar5;
              }
              uVar7 = local_78;
              lVar11 = local_70;
              __ptr_00 = local_90;
              pVVar4 = local_80;
              uVar15 = uVar16;
              if (pwVar5 == (word *)0x0) {
                local_80->nSize = uVar10;
                local_80->nCap = uVar6;
                local_a0 = local_98;
                local_80->nSize = (int)local_88 + (int)lVar12;
                local_80->nCap = iVar13;
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                              ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
            }
LAB_0076f532:
            uVar17 = uVar17 << (bVar2 & 0x3f) & uVar8 | (uVar8 & uVar17) >> (bVar2 & 0x3f);
            *(ulong *)((long)pVVar4->pArray + lVar12 * 8 + lVar11) = uVar17;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x40);
          uVar14 = (uint)uVar15;
          iVar13 = (int)local_88;
          if (local_40 != uVar17) {
            pVVar4->nSize = uVar10;
            pVVar4->nCap = uVar6;
            local_a0 = local_98;
            pVVar4->nSize = iVar13 + 0x40;
            pVVar4->nCap = uVar14;
            __assert_fail("tTemp2 == tCur",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                          ,0xad,"Vec_Wrd_t *Mf_ManTruthCollect(int)");
          }
          uVar8 = uVar7 + 0x40;
          iVar1 = local_48[local_38];
          bVar2 = (byte)(1L << ((byte)iVar1 & 0x3f));
          uVar17 = (uVar17 & s_PMasks[iVar1][2]) >> (bVar2 & 0x3f) |
                   (s_PMasks[iVar1][1] & uVar17) << (bVar2 & 0x3f) | s_PMasks[iVar1][0] & uVar17;
          lVar9 = local_38 + 1;
        } while (lVar9 != 0x2d0);
        if (local_50 != uVar17) {
          pVVar4->nSize = uVar10;
          pVVar4->nCap = uVar6;
          local_a0 = local_98;
          pVVar4->nSize = iVar13 + 0x40;
          pVVar4->nCap = uVar14;
          __assert_fail("tTemp1 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                        ,0xb0,"Vec_Wrd_t *Mf_ManTruthCollect(int)");
        }
        uVar8 = local_78 + 0x40;
        lVar11 = local_58 + 1;
      } while (local_58 == 0);
      lVar9 = local_60 + 1;
      uVar10 = iVar13 + 0x40;
      uVar6 = uVar14;
    } while (lVar9 < local_68->nSize);
    pVVar4->nSize = iVar13 + 0x40;
    pVVar4->nCap = uVar14;
    local_a0 = local_98;
    pVVar3 = local_68;
    __ptr = local_48;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    __ptr_00 = local_90;
  }
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  printf("Original = %d.  ",(ulong)(uint)pVVar3->nSize);
  if (pVVar3->pArray != (word *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (word *)0x0;
  }
  if (pVVar3 != (Vec_Wrd_t *)0x0) {
    free(pVVar3);
  }
  pVVar4 = local_80;
  iVar13 = local_80->nSize;
  printf("Total = %d.  ");
  pVVar3 = Vec_WrdUniqifyHash(pVVar4,iVar13);
  if (pVVar4->pArray != (word *)0x0) {
    free(pVVar4->pArray);
    local_80->pArray = (word *)0x0;
    pVVar4 = local_80;
  }
  free(pVVar4);
  iVar13 = pVVar3->nSize;
  lVar9 = (long)iVar13;
  printf("Unique = %d.  ");
  if (0 < lVar9) {
    pwVar5 = pVVar3->pArray;
    lVar11 = 0;
    do {
      local_a0 = pwVar5[lVar11];
      iVar13 = 6;
      Mf_ManTruthCanonicize(&local_a0,6);
      pwVar5[lVar11] = local_a0;
      lVar11 = lVar11 + 1;
    } while (lVar9 != lVar11);
  }
  pVVar4 = Vec_WrdUniqifyHash(pVVar3,iVar13);
  if (pVVar3->pArray != (word *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (word *)0x0;
  }
  if (pVVar3 != (Vec_Wrd_t *)0x0) {
    free(pVVar3);
  }
  printf("Unique = %d.  \n",(ulong)(uint)pVVar4->nSize);
  return pVVar4;
}

Assistant:

Vec_Wrd_t * Mf_ManTruthCollect( int Limit )
{
    extern Vec_Wrd_t * Mpm_ManGetTruthWithCnf( int Limit );
    int * pPerm = Extra_PermSchedule( 6 );
    int * pComp = Extra_GreyCodeSchedule( 6 );
    Vec_Wrd_t * vTruths = Mpm_ManGetTruthWithCnf( Limit );
    Vec_Wrd_t * vResult = Vec_WrdAlloc( 1 << 20 );
    word uTruth, tCur, tTemp1, tTemp2;
    int i, p, c, k;
    Vec_WrdForEachEntry( vTruths, uTruth, k )
    {
        for ( i = 0; i < 2; i++ )
        {
            tCur = i ? ~uTruth : uTruth;
            tTemp1 = tCur;
            for ( p = 0; p < 720; p++ )
            {
                tTemp2 = tCur;
                for ( c = 0; c < 64; c++ )
                {
                    tCur = Abc_Tt6Flip( tCur, pComp[c] );
                    Vec_WrdPush( vResult, tCur );
                }
                assert( tTemp2 == tCur );
                tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
            }
            assert( tTemp1 == tCur );
        }
    }
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    printf( "Original = %d.  ", Vec_WrdSize(vTruths) );
    Vec_WrdFree( vTruths );
    printf( "Total = %d.  ", Vec_WrdSize(vResult) );
    vTruths = Vec_WrdUniqifyHash( vResult, 1 );
    Vec_WrdFree( vResult );
    printf( "Unique = %d.  ", Vec_WrdSize(vTruths) );
    Vec_WrdForEachEntry( vTruths, uTruth, k )
    {
        Mf_ManTruthCanonicize( &uTruth, 6 );
        Vec_WrdWriteEntry( vTruths, k, uTruth );
    }
    vResult = Vec_WrdUniqifyHash( vTruths, 1 );
    Vec_WrdFree( vTruths );
    printf( "Unique = %d.  \n", Vec_WrdSize(vResult) );
    return vResult;
}